

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.h
# Opt level: O1

void __thiscall CfgNode::BlockData::~BlockData(BlockData *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_Data)._vptr_Data = (_func_int **)&PTR__BlockData_00117a58;
  std::
  _Rb_tree<int,_std::pair<const_int,_CFG_*>,_std::_Select1st<std::pair<const_int,_CFG_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>
  ::~_Rb_tree(&(this->m_signalHandlers)._M_t);
  std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
  ~_Rb_tree(&(this->m_calls)._M_t);
  p_Var2 = (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->m_instrs) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

int size() const { return m_size; }